

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

void __thiscall CNetBan::Update(CNetBan *this)

{
  int iVar1;
  CBan<NETADDR> *pCVar2;
  CBan<CNetRange> *pCVar3;
  char *pcVar4;
  IConsole *pIVar5;
  CNetBan *in_RDI;
  long in_FS_OFFSET;
  int Now;
  char aNetStr [256];
  char aBuf [256];
  uint in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  CBanPool<NETADDR,_1> *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 uVar6;
  char local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = time_timestamp();
  while( true ) {
    pCVar2 = CBanPool<NETADDR,_1>::First(&in_RDI->m_BanAddrPool);
    uVar6 = false;
    if (pCVar2 != (CBan<NETADDR> *)0x0) {
      pCVar2 = CBanPool<NETADDR,_1>::First(&in_RDI->m_BanAddrPool);
      uVar6 = false;
      if ((pCVar2->m_Info).m_Expires != -1) {
        pCVar2 = CBanPool<NETADDR,_1>::First(&in_RDI->m_BanAddrPool);
        uVar6 = (pCVar2->m_Info).m_Expires < iVar1;
      }
    }
    if ((bool)uVar6 == false) break;
    in_stack_fffffffffffffdc8 = local_108;
    CBanPool<NETADDR,_1>::First(&in_RDI->m_BanAddrPool);
    pcVar4 = NetToString((CNetBan *)CONCAT17(uVar6,in_stack_fffffffffffffdd8),
                         (NETADDR_conflict *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffdc4);
    str_format(in_stack_fffffffffffffdc8,0x100,"ban %s expired",pcVar4);
    pIVar5 = Console(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,0,"net_ban",local_108);
    in_stack_fffffffffffffdd0 = &in_RDI->m_BanAddrPool;
    pCVar2 = CBanPool<NETADDR,_1>::First(&in_RDI->m_BanAddrPool);
    CBanPool<NETADDR,_1>::Remove(in_stack_fffffffffffffdd0,pCVar2);
  }
  uVar6 = 0;
  while( true ) {
    pCVar3 = CBanPool<CNetRange,_16>::First(&in_RDI->m_BanRangePool);
    in_stack_fffffffffffffdc4 = in_stack_fffffffffffffdc4 & 0xffffff;
    if (pCVar3 != (CBan<CNetRange> *)0x0) {
      pCVar3 = CBanPool<CNetRange,_16>::First(&in_RDI->m_BanRangePool);
      in_stack_fffffffffffffdc4 = in_stack_fffffffffffffdc4 & 0xffffff;
      if ((pCVar3->m_Info).m_Expires != -1) {
        pCVar3 = CBanPool<CNetRange,_16>::First(&in_RDI->m_BanRangePool);
        in_stack_fffffffffffffdc4 =
             CONCAT13((pCVar3->m_Info).m_Expires < iVar1,(int3)in_stack_fffffffffffffdc4);
      }
    }
    if ((char)(in_stack_fffffffffffffdc4 >> 0x18) == '\0') break;
    CBanPool<CNetRange,_16>::First(&in_RDI->m_BanRangePool);
    pcVar4 = NetToString((CNetBan *)CONCAT17(uVar6,in_stack_fffffffffffffdd8),
                         (CNetRange *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffdc4);
    str_format(local_108,0x100,"ban %s expired",pcVar4);
    pIVar5 = Console(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,0,"net_ban",local_108);
    pCVar3 = CBanPool<CNetRange,_16>::First(&in_RDI->m_BanRangePool);
    CBanPool<CNetRange,_16>::Remove(&in_RDI->m_BanRangePool,pCVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::Update()
{
	int Now = time_timestamp();

	// remove expired bans
	char aBuf[256], aNetStr[256];
	while(m_BanAddrPool.First() && m_BanAddrPool.First()->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER && m_BanAddrPool.First()->m_Info.m_Expires < Now)
	{
		str_format(aBuf, sizeof(aBuf), "ban %s expired", NetToString(&m_BanAddrPool.First()->m_Data, aNetStr, sizeof(aNetStr)));
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		m_BanAddrPool.Remove(m_BanAddrPool.First());
	}
	while(m_BanRangePool.First() && m_BanRangePool.First()->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER && m_BanRangePool.First()->m_Info.m_Expires < Now)
	{
		str_format(aBuf, sizeof(aBuf), "ban %s expired", NetToString(&m_BanRangePool.First()->m_Data, aNetStr, sizeof(aNetStr)));
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		m_BanRangePool.Remove(m_BanRangePool.First());
	}
}